

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

double __thiscall Json::Value::asDouble(Value *this)

{
  runtime_error *this_00;
  double dVar1;
  
  switch(this->field_0x8) {
  case 1:
    dVar1 = (double)(this->value_).int_;
    break;
  case 2:
    dVar1 = ((double)CONCAT44(0x45300000,(int)((ulong)(this->value_).int_ >> 0x20)) -
            1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)(this->value_).int_) - 4503599627370496.0);
    break;
  case 3:
    dVar1 = (double)(this->value_).int_;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to double.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    dVar1 = 0.0;
  }
  return dVar1;
}

Assistant:

double 
Value::asDouble() const
{
   switch ( type_ )
   {
   case intValue:
      return static_cast<double>( value_.int_ );
   case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
      return static_cast<double>( value_.uint_ );
#else // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
      return integerToDouble( value_.uint_ );
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
   case realValue:
      return value_.real_;
   case nullValue:
      return 0.0;
   case booleanValue:
      return value_.bool_ ? 1.0 : 0.0;
   default:
      break;
   }
   JSON_FAIL_MESSAGE("Value is not convertible to double.");
}